

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryIsPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *instance;
  long lVar7;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *dynamicObject;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x14b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cef9dd;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x14e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cef9dd;
    *puVar5 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x150,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00cef9dd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) != 1) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar4 = JavascriptOperators::IsObject(pvVar6);
    if (BVar4 != 0) {
      args.super_Arguments.Values = (Type)0x0;
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      BVar4 = JavascriptConversion::ToObject
                        (pvVar6,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
      if (BVar4 == 0) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Object.prototype.isPrototypeOf");
      }
      pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      instance = VarTo<Js::RecyclableObject>(pvVar6);
      if (*args.super_Arguments.Values[1] == 0x50) {
        pvVar6 = GlobalObject::ToThis((GlobalObject *)args.super_Arguments.Values);
        args.super_Arguments.Values = (Type)VarTo<Js::RecyclableObject>(pvVar6);
      }
      do {
        BVar4 = JavascriptOperators::IsNull(instance);
        if (BVar4 != 0) {
          lVar7 = 0x3f0;
          goto LAB_00cef9cc;
        }
        instance = JavascriptOperators::GetPrototype(instance);
      } while ((RecyclableObject *)args.super_Arguments.Values != instance);
      lVar7 = 1000;
LAB_00cef9cc:
      return *(Var *)((long)&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase).super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar7);
    }
  }
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         booleanFalse.ptr;
}

Assistant:

Var JavascriptObject::EntryIsPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    // no property specified
    if (args.Info.Count == 1 || !JavascriptOperators::IsObject(args[1]))
    {
        return scriptContext->GetLibrary()->GetFalse();
    }

    RecyclableObject* dynamicObject = nullptr;
    if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.isPrototypeOf"));
    }
    RecyclableObject* value = VarTo<RecyclableObject>(args[1]);

    if (dynamicObject->GetTypeId() == TypeIds_GlobalObject)
    {
        dynamicObject = VarTo<RecyclableObject>(static_cast<Js::GlobalObject*>(dynamicObject)->ToThis());
    }

    while (!JavascriptOperators::IsNull(value))
    {
        value = JavascriptOperators::GetPrototype(value);
        if (dynamicObject == value)
        {
            return scriptContext->GetLibrary()->GetTrue();
        }
    }

    return scriptContext->GetLibrary()->GetFalse();
}